

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleARGBFilterCols_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (1 < dst_width) {
    iVar3 = 0;
    do {
      uVar4 = (uint)x >> 9 & 0x7f;
      uVar1 = *(uint *)(src_argb + (long)(x >> 0x10) * 4);
      uVar2 = *(uint *)(src_argb + (long)(x >> 0x10) * 4 + 4);
      uVar5 = uVar4 ^ 0x7f;
      *(uint *)dst_argb =
           (uVar2 & 0xff) * uVar4 + (uVar1 & 0xff) * uVar5 >> 7 |
           ((uVar2 >> 0x18) * uVar4 + (uVar1 >> 0x18) * uVar5 & 0xffffff80) << 0x11 |
           ((uVar2 >> 0x10 & 0xff) * uVar4 + (uVar1 >> 0x10 & 0xff) * uVar5) * 0x200 & 0x1ff0000 |
           ((uVar2 >> 8 & 0xff) * uVar4 + (uVar1 >> 8 & 0xff) * uVar5) * 2 & 0x1ff00;
      uVar4 = x + dx;
      uVar5 = uVar4 >> 9 & 0x7f;
      uVar1 = *(uint *)(src_argb + (long)((int)uVar4 >> 0x10) * 4);
      uVar2 = *(uint *)(src_argb + (long)((int)uVar4 >> 0x10) * 4 + 4);
      uVar6 = uVar5 ^ 0x7f;
      *(uint *)((long)dst_argb + 4) =
           (uVar2 & 0xff) * uVar5 + (uVar1 & 0xff) * uVar6 >> 7 |
           ((uVar2 >> 0x18) * uVar5 + (uVar1 >> 0x18) * uVar6 & 0xffffff80) << 0x11 |
           ((uVar2 >> 0x10 & 0xff) * uVar5 + (uVar1 >> 0x10 & 0xff) * uVar6) * 0x200 & 0x1ff0000 |
           ((uVar2 >> 8 & 0xff) * uVar5 + (uVar1 >> 8 & 0xff) * uVar6) * 2 & 0x1ff00;
      x = uVar4 + dx;
      dst_argb = (uint8_t *)((long)dst_argb + 8);
      iVar3 = iVar3 + 2;
    } while (iVar3 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    uVar4 = (uint)x >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)(x >> 0x10) * 4);
    uVar2 = *(uint *)(src_argb + (long)(x >> 0x10) * 4 + 4);
    uVar5 = uVar4 ^ 0x7f;
    *(uint *)dst_argb =
         (uVar2 & 0xff) * uVar4 + (uVar1 & 0xff) * uVar5 >> 7 |
         ((uVar2 >> 0x18) * uVar4 + (uVar1 >> 0x18) * uVar5 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar4 + (uVar1 >> 0x10 & 0xff) * uVar5 & 0xff80) << 9 |
         ((uVar2 >> 8 & 0xff) * uVar4 + (uVar1 >> 8 & 0xff) * uVar5) * 2 & 0x1ff00;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols_C(uint8_t* dst_argb,
                           const uint8_t* src_argb,
                           int dst_width,
                           int x,
                           int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}